

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_general_insertion<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true>>>
               (void)

{
  uint uVar1;
  mapped_type mVar2;
  _Hash_node_base *p_Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  pool<boost::default_user_allocator_malloc_free> *ppVar25;
  pool<boost::default_user_allocator_malloc_free> *ppVar26;
  Index IVar27;
  pointer pvVar28;
  mapped_type *pmVar29;
  Dimension DVar30;
  pointer p;
  _Hash_node_base *p_Var31;
  ulong uVar32;
  const_iterator __end0;
  pointer puVar33;
  _Hash_node_base *p_Var34;
  const_iterator __begin0;
  pointer puVar35;
  pointer puVar36;
  const_iterator __end0_1;
  Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_> m;
  value_type col1;
  value_type col2;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  undefined **local_760;
  ulong local_758;
  shared_count sStack_750;
  undefined4 **local_748;
  undefined **local_740;
  char *local_738;
  undefined8 *local_730;
  char *local_728;
  undefined **local_720;
  undefined1 local_718;
  undefined8 *local_710;
  undefined ***local_708;
  undefined4 local_6fc;
  int local_6f8;
  Index local_6f4;
  undefined4 *local_6f0;
  undefined **local_6e8;
  mapped_type *local_6e0;
  pool<boost::default_user_allocator_malloc_free> *local_6d8;
  undefined1 local_6d0 [56];
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_698;
  bool local_660;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_658;
  Index local_620;
  pool<boost::default_user_allocator_malloc_free> *local_618;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_610;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_5f8;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_5e0;
  undefined1 local_5c8 [8];
  undefined8 local_5c0;
  shared_count sStack_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  undefined1 *local_590;
  undefined1 *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  undefined1 *local_560;
  undefined1 *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  char *local_538;
  undefined1 *local_530;
  undefined1 *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  undefined1 *local_4a0;
  undefined1 *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_general_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true>>>>
            ();
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_5f8,
             local_5e0.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1);
  puVar36 = local_5e0.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  pvVar28 = local_5e0.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish + -1;
  if (puVar36 != (pointer)0x0) {
    pvVar28 = local_5e0.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1;
    local_5e0.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_5e0.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    operator_delete(puVar36,(long)(pvVar28->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar36)
    ;
    pvVar28 = local_5e0.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  local_5e0.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar28;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_610,
             local_5e0.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1);
  puVar36 = local_5e0.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  pvVar28 = local_5e0.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish + -1;
  if (puVar36 != (pointer)0x0) {
    pvVar28 = local_5e0.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1;
    local_5e0.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_5e0.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    operator_delete(puVar36,(long)(pvVar28->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar36)
    ;
    pvVar28 = local_5e0.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  local_5e0.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar28;
  local_6d8 = (pool<boost::default_user_allocator_malloc_free> *)operator_new(0x38);
  (((Entry_constructor *)&local_6d8->super_simple_segregated_storage<unsigned_long>)->entryPool_).
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (local_6d8->list).ptr = (char *)0x0;
  (local_6d8->list).sz = 0;
  local_6d8->requested_size = 0x18;
  local_6d8->next_size = 0x20;
  local_6d8->start_size = 0x20;
  local_6d8->max_size = 0;
  Gudhi::persistence_matrix::
  Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true>>>
  ::Base_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true>>>
              *)local_6d0,&local_5e0,(Column_settings *)local_6d8);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x18e);
  if (local_658._M_buckets[local_658._M_bucket_count != 1] != (__node_base_ptr)0x0) {
    p_Var34 = local_658._M_buckets[local_658._M_bucket_count != 1]->_M_nxt;
    uVar1 = *(uint *)&p_Var34[1]._M_nxt;
    while (uVar1 != 1) {
      p_Var34 = p_Var34->_M_nxt;
      if ((p_Var34 == (_Hash_node_base *)0x0) ||
         (uVar1 = *(uint *)&p_Var34[1]._M_nxt,
         (uint)((ulong)uVar1 % local_658._M_bucket_count) != (uint)(local_658._M_bucket_count != 1))
         ) goto LAB_0011bb7d;
    }
    if (*(__node_base_ptr *)local_6d0._0_8_ != (__node_base_ptr)0x0) {
      p_Var3 = (*(__node_base_ptr *)local_6d0._0_8_)->_M_nxt;
      uVar1 = *(uint *)&p_Var3[1]._M_nxt;
      goto joined_r0x0011970e;
    }
  }
  goto LAB_0011bb7d;
  while( true ) {
    if (p_Var31 == (_Hash_node_base *)0x0) goto LAB_0011bb5e;
    if (*(int *)&p_Var31[2]._M_nxt == *(int *)((long)&p_Var3[1]._M_nxt + 4)) break;
LAB_00119746:
    p_Var31 = p_Var31->_M_nxt;
    if (p_Var31 == p_Var34) break;
  }
  local_760 = (undefined **)CONCAT71(local_760._1_7_,p_Var31 == p_Var34);
  local_758 = 0;
  sStack_750.pi_ = (sp_counted_base *)0x0;
  local_740 = (undefined **)0x1897b9;
  local_738 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001b8350;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_58 = "";
  local_708 = &local_740;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_750);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,399);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_658._M_bucket_count;
  uVar32 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar4,0);
  if (local_658._M_buckets[uVar32 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var34 = local_658._M_buckets[uVar32 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var34[1]._M_nxt;
    while (uVar1 != 3) {
      p_Var34 = p_Var34->_M_nxt;
      if ((p_Var34 == (_Hash_node_base *)0x0) ||
         (uVar1 = *(uint *)&p_Var34[1]._M_nxt, (ulong)uVar1 % local_658._M_bucket_count != uVar32))
      goto LAB_0011bb89;
    }
    if (*(__node_base_ptr *)local_6d0._0_8_ != (__node_base_ptr)0x0) {
      p_Var3 = (*(__node_base_ptr *)local_6d0._0_8_)->_M_nxt;
      uVar1 = *(uint *)&p_Var3[1]._M_nxt;
      goto joined_r0x00119884;
    }
  }
  goto LAB_0011bb89;
  while( true ) {
    if (p_Var31 == (_Hash_node_base *)0x0) goto LAB_0011bb5e;
    if (*(int *)&p_Var31[2]._M_nxt == *(int *)((long)&p_Var3[1]._M_nxt + 4)) break;
LAB_001198bc:
    p_Var31 = p_Var31->_M_nxt;
    if (p_Var31 == p_Var34) break;
  }
  local_758 = 0;
  sStack_750.pi_ = (sp_counted_base *)0x0;
  local_740 = (undefined **)0x1897cf;
  local_738 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001b8350;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_88 = "";
  local_708 = &local_740;
  local_760._0_1_ = p_Var31 != p_Var34;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_750);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,400);
  if (*local_658._M_buckets == (__node_base_ptr)0x0) {
LAB_0011bbb9:
    std::__throw_out_of_range("_Map_base::at");
  }
  p_Var34 = (*local_658._M_buckets)->_M_nxt;
  uVar1 = *(uint *)&p_Var34[1]._M_nxt;
  while (uVar1 != 0) {
    p_Var34 = p_Var34->_M_nxt;
    if ((p_Var34 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var34[1]._M_nxt, (ulong)uVar1 % local_658._M_bucket_count != 0))
    goto LAB_0011bbb9;
  }
  local_760._0_1_ = p_Var34[4]._M_nxt == p_Var34 + 4 || p_Var34[4]._M_nxt == (_Hash_node_base *)0x0;
  local_758 = 0;
  sStack_750.pi_ = (sp_counted_base *)0x0;
  local_740 = (undefined **)0x1897e6;
  local_738 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001b8350;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_b8 = "";
  local_708 = &local_740;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_750);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x191);
  if (local_658._M_buckets[local_658._M_bucket_count != 1] == (__node_base_ptr)0x0)
  goto LAB_0011bbd1;
  p_Var34 = local_658._M_buckets[local_658._M_bucket_count != 1]->_M_nxt;
  uVar1 = *(uint *)&p_Var34[1]._M_nxt;
  while (uVar1 != 1) {
    p_Var34 = p_Var34->_M_nxt;
    if ((p_Var34 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var34[1]._M_nxt,
       (uint)((ulong)uVar1 % local_658._M_bucket_count) != (uint)(local_658._M_bucket_count != 1)))
    {
LAB_0011bbd1:
      std::__throw_out_of_range("_Map_base::at");
    }
  }
  local_760._0_1_ = p_Var34[4]._M_nxt == p_Var34 + 4 || p_Var34[4]._M_nxt == (_Hash_node_base *)0x0;
  local_758 = 0;
  sStack_750.pi_ = (sp_counted_base *)0x0;
  local_740 = (undefined **)0x1897fa;
  local_738 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001b8350;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_e8 = "";
  local_708 = &local_740;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_750);
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x192);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_658._M_bucket_count;
  uVar32 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2)) % auVar5,0);
  if (local_658._M_buckets[uVar32 & 0xffffffff] == (__node_base_ptr)0x0) {
LAB_0011bbdd:
    std::__throw_out_of_range("_Map_base::at");
  }
  p_Var34 = local_658._M_buckets[uVar32 & 0xffffffff]->_M_nxt;
  uVar1 = *(uint *)&p_Var34[1]._M_nxt;
  while (uVar1 != 2) {
    p_Var34 = p_Var34->_M_nxt;
    if ((p_Var34 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var34[1]._M_nxt, (ulong)uVar1 % local_658._M_bucket_count != uVar32))
    goto LAB_0011bbdd;
  }
  local_760._0_1_ = p_Var34[4]._M_nxt == p_Var34 + 4 || p_Var34[4]._M_nxt == (_Hash_node_base *)0x0;
  local_758 = 0;
  sStack_750.pi_ = (sp_counted_base *)0x0;
  local_740 = (undefined **)0x18980e;
  local_738 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001b8350;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_118 = "";
  local_708 = &local_740;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_750);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x193);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_658._M_bucket_count;
  uVar32 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar6,0);
  if (local_658._M_buckets[uVar32 & 0xffffffff] == (__node_base_ptr)0x0) goto LAB_0011bbe9;
  p_Var34 = local_658._M_buckets[uVar32 & 0xffffffff]->_M_nxt;
  uVar1 = *(uint *)&p_Var34[1]._M_nxt;
  while (uVar1 != 3) {
    p_Var34 = p_Var34->_M_nxt;
    if ((p_Var34 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var34[1]._M_nxt, (ulong)uVar1 % local_658._M_bucket_count != uVar32)) {
LAB_0011bbe9:
      std::__throw_out_of_range("_Map_base::at");
    }
  }
  local_760._0_1_ = p_Var34[4]._M_nxt != p_Var34 + 4 && p_Var34[4]._M_nxt != (_Hash_node_base *)0x0;
  local_758 = 0;
  sStack_750.pi_ = (sp_counted_base *)0x0;
  local_740 = (undefined **)0x189822;
  local_738 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001b8350;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_148 = "";
  local_708 = &local_740;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_750);
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x194);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_658._M_bucket_count;
  uVar32 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) % auVar7,0);
  if (local_658._M_buckets[uVar32 & 0xffffffff] == (__node_base_ptr)0x0) {
LAB_0011bbf5:
    std::__throw_out_of_range("_Map_base::at");
  }
  p_Var34 = local_658._M_buckets[uVar32 & 0xffffffff]->_M_nxt;
  uVar1 = *(uint *)&p_Var34[1]._M_nxt;
  while (uVar1 != 4) {
    p_Var34 = p_Var34->_M_nxt;
    if ((p_Var34 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var34[1]._M_nxt, (ulong)uVar1 % local_658._M_bucket_count != uVar32))
    goto LAB_0011bbf5;
  }
  local_760._0_1_ = p_Var34[4]._M_nxt == p_Var34 + 4 || p_Var34[4]._M_nxt == (_Hash_node_base *)0x0;
  local_758 = 0;
  sStack_750.pi_ = (sp_counted_base *)0x0;
  local_740 = (undefined **)0x189837;
  local_738 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001b8350;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_178 = "";
  local_708 = &local_740;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_750);
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_190,0x195);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_658._M_bucket_count;
  uVar32 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(5)) % auVar8,0);
  if (local_658._M_buckets[uVar32 & 0xffffffff] == (__node_base_ptr)0x0) goto LAB_0011bc01;
  p_Var34 = local_658._M_buckets[uVar32 & 0xffffffff]->_M_nxt;
  uVar1 = *(uint *)&p_Var34[1]._M_nxt;
  while (uVar1 != 5) {
    p_Var34 = p_Var34->_M_nxt;
    if ((p_Var34 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var34[1]._M_nxt, (ulong)uVar1 % local_658._M_bucket_count != uVar32)) {
LAB_0011bc01:
      std::__throw_out_of_range("_Map_base::at");
    }
  }
  local_760._0_1_ = p_Var34[4]._M_nxt != p_Var34 + 4 && p_Var34[4]._M_nxt != (_Hash_node_base *)0x0;
  local_758 = 0;
  sStack_750.pi_ = (sp_counted_base *)0x0;
  local_740 = (undefined **)0x18984b;
  local_738 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001b8350;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1a8 = "";
  local_708 = &local_740;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_750);
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c0,0x196);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_658._M_bucket_count;
  uVar32 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(6)) % auVar9,0);
  if (local_658._M_buckets[uVar32 & 0xffffffff] == (__node_base_ptr)0x0) {
LAB_0011bc0d:
    std::__throw_out_of_range("_Map_base::at");
  }
  p_Var34 = local_658._M_buckets[uVar32 & 0xffffffff]->_M_nxt;
  uVar1 = *(uint *)&p_Var34[1]._M_nxt;
  while (uVar1 != 6) {
    p_Var34 = p_Var34->_M_nxt;
    if ((p_Var34 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var34[1]._M_nxt, (ulong)uVar1 % local_658._M_bucket_count != uVar32))
    goto LAB_0011bc0d;
  }
  local_760._0_1_ = p_Var34[4]._M_nxt != p_Var34 + 4 && p_Var34[4]._M_nxt != (_Hash_node_base *)0x0;
  local_758 = 0;
  sStack_750.pi_ = (sp_counted_base *)0x0;
  local_740 = (undefined **)0x189860;
  local_738 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001b8350;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1d8 = "";
  local_708 = &local_740;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_750);
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f0,0x197);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_658._M_bucket_count;
  uVar32 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(7)) % auVar10,0);
  if (local_658._M_buckets[uVar32 & 0xffffffff] == (__node_base_ptr)0x0) goto LAB_0011bc19;
  p_Var34 = local_658._M_buckets[uVar32 & 0xffffffff]->_M_nxt;
  uVar1 = *(uint *)&p_Var34[1]._M_nxt;
  while (uVar1 != 7) {
    p_Var34 = p_Var34->_M_nxt;
    if ((p_Var34 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var34[1]._M_nxt, (ulong)uVar1 % local_658._M_bucket_count != uVar32)) {
LAB_0011bc19:
      std::__throw_out_of_range("_Map_base::at");
    }
  }
  local_760._0_1_ = p_Var34[4]._M_nxt != p_Var34 + 4 && p_Var34[4]._M_nxt != (_Hash_node_base *)0x0;
  local_758 = 0;
  sStack_750.pi_ = (sp_counted_base *)0x0;
  local_740 = (undefined **)0x189875;
  local_738 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001b8350;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_208 = "";
  local_708 = &local_740;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_750);
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,0x198);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_658._M_bucket_count;
  uVar32 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(8)) % auVar11,0);
  if (local_658._M_buckets[uVar32 & 0xffffffff] == (__node_base_ptr)0x0) {
LAB_0011bc25:
    std::__throw_out_of_range("_Map_base::at");
  }
  p_Var34 = local_658._M_buckets[uVar32 & 0xffffffff]->_M_nxt;
  uVar1 = *(uint *)&p_Var34[1]._M_nxt;
  while (uVar1 != 8) {
    p_Var34 = p_Var34->_M_nxt;
    if ((p_Var34 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var34[1]._M_nxt, (ulong)uVar1 % local_658._M_bucket_count != uVar32))
    goto LAB_0011bc25;
  }
  local_760._0_1_ = p_Var34[4]._M_nxt != p_Var34 + 4 && p_Var34[4]._M_nxt != (_Hash_node_base *)0x0;
  local_758 = 0;
  sStack_750.pi_ = (sp_counted_base *)0x0;
  local_740 = (undefined **)0x18988a;
  local_738 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001b8350;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_238 = "";
  local_708 = &local_740;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_750);
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_250,0x199);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_658._M_bucket_count;
  uVar32 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(9)) % auVar12,0);
  if (local_658._M_buckets[uVar32 & 0xffffffff] == (__node_base_ptr)0x0) goto LAB_0011bc31;
  p_Var34 = local_658._M_buckets[uVar32 & 0xffffffff]->_M_nxt;
  uVar1 = *(uint *)&p_Var34[1]._M_nxt;
  while (uVar1 != 9) {
    p_Var34 = p_Var34->_M_nxt;
    if ((p_Var34 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var34[1]._M_nxt, (ulong)uVar1 % local_658._M_bucket_count != uVar32)) {
LAB_0011bc31:
      std::__throw_out_of_range("_Map_base::at");
    }
  }
  local_760 = (undefined **)
              CONCAT71(local_760._1_7_,
                       p_Var34[4]._M_nxt != p_Var34 + 4 &&
                       p_Var34[4]._M_nxt != (_Hash_node_base *)0x0);
  local_758 = 0;
  sStack_750.pi_ = (sp_counted_base *)0x0;
  local_740 = (undefined **)0x18989f;
  local_738 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001b8350;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_268 = "";
  local_708 = &local_740;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_750);
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_280,0x19a);
  local_738 = (char *)((ulong)local_738 & 0xffffffffffffff00);
  local_740 = &PTR__lazy_ostream_001b8210;
  local_730 = &boost::unit_test::lazy_ostream::inst;
  local_728 = "";
  local_6e8 = (undefined **)&local_6f8;
  local_6f8 = (int)local_658._M_element_count;
  local_6f0 = &local_6fc;
  local_5c8[0] = (int)local_658._M_element_count == 10;
  local_6fc = 10;
  local_5c0 = 0;
  sStack_5b8.pi_ = (sp_counted_base *)0x0;
  local_5b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_5a8 = "";
  local_708 = &local_6e8;
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001b8180;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_748 = &local_6f0;
  local_758 = local_758 & 0xffffffffffffff00;
  local_760 = &PTR__lazy_ostream_001b81d0;
  sStack_750.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_5b8);
  puVar36 = local_610.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_6e0 = local_610.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_6f4 = local_620;
  puVar33 = local_610.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (local_660 == true) {
    Gudhi::persistence_matrix::
    Base_swap<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>
    ::_orderRows((Base_swap<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>
                  *)local_6d0);
    puVar33 = local_610.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  if (local_610.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != puVar33) {
    puVar35 = local_610.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      mVar2 = *puVar35;
      local_720 = (undefined **)CONCAT44(local_720._4_4_,mVar2);
      pmVar29 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)local_6d0,(key_type *)&local_720);
      *pmVar29 = mVar2;
      mVar2 = (mapped_type)local_720;
      pmVar29 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)(local_6d0 + 0x38),(key_type *)&local_720);
      *pmVar29 = mVar2;
      puVar35 = puVar35 + 1;
    } while (puVar35 != puVar33);
  }
  DVar30 = 0;
  if (puVar36 != local_6e0) {
    DVar30 = (int)((ulong)((long)puVar36 - (long)local_6e0) >> 2) + -1;
  }
  Gudhi::persistence_matrix::
  Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true>>>
  ::_container_insert<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true>>>
              *)local_6d0,&local_610,local_6f4,DVar30);
  local_620 = local_620 + 1;
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_298 = "";
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2a0,0x19c);
  local_738 = (char *)((ulong)local_738 & 0xffffffffffffff00);
  local_740 = &PTR__lazy_ostream_001b8210;
  local_730 = &boost::unit_test::lazy_ostream::inst;
  local_728 = "";
  local_6f8 = (int)local_658._M_element_count;
  local_5c8[0] = (int)local_658._M_element_count == 0xb;
  local_6fc = 0xb;
  local_5c0 = 0;
  sStack_5b8.pi_ = (sp_counted_base *)0x0;
  local_5b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_5a8 = "";
  local_6e8 = (undefined **)&local_6f8;
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001b8180;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_708 = &local_6e8;
  local_6f0 = &local_6fc;
  local_758 = local_758 & 0xffffffffffffff00;
  local_760 = &PTR__lazy_ostream_001b81d0;
  sStack_750.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_748 = &local_6f0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_5b8);
  puVar33 = local_5f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  puVar36 = local_5f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  IVar27 = local_620;
  puVar35 = local_5f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (local_660 == true) {
    Gudhi::persistence_matrix::
    Base_swap<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>
    ::_orderRows((Base_swap<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>
                  *)local_6d0);
    puVar35 = local_5f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  local_6e0 = puVar36;
  local_6f4 = IVar27;
  if (local_5f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != puVar35) {
    puVar36 = local_5f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      mVar2 = *puVar36;
      local_720 = (undefined **)CONCAT44(local_720._4_4_,mVar2);
      pmVar29 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)local_6d0,(key_type *)&local_720);
      *pmVar29 = mVar2;
      mVar2 = (mapped_type)local_720;
      pmVar29 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)(local_6d0 + 0x38),(key_type *)&local_720);
      *pmVar29 = mVar2;
      puVar36 = puVar36 + 1;
    } while (puVar36 != puVar35);
  }
  DVar30 = 0;
  if (puVar33 != local_6e0) {
    DVar30 = (int)((ulong)((long)puVar33 - (long)local_6e0) >> 2) + -1;
  }
  Gudhi::persistence_matrix::
  Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true>>>
  ::_container_insert<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true>>>
              *)local_6d0,&local_5f8,local_6f4,DVar30);
  local_620 = local_620 + 1;
  local_2c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2c0,0x19e);
  local_738 = (char *)((ulong)local_738 & 0xffffffffffffff00);
  local_740 = &PTR__lazy_ostream_001b8210;
  local_730 = &boost::unit_test::lazy_ostream::inst;
  local_728 = "";
  local_6f8 = (int)local_658._M_element_count;
  local_5c8[0] = (int)local_658._M_element_count == 0xc;
  local_6fc = 0xc;
  local_5c0 = 0;
  sStack_5b8.pi_ = (sp_counted_base *)0x0;
  local_5b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_5a8 = "";
  local_6e8 = (undefined **)&local_6f8;
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001b8180;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_708 = &local_6e8;
  local_6f0 = &local_6fc;
  local_758 = local_758 & 0xffffffffffffff00;
  local_760 = &PTR__lazy_ostream_001b81d0;
  sStack_750.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_748 = &local_6f0;
  boost::test_tools::tt_detail::report_assertion
            (local_5c8,&local_740,&local_5b0,0x19e,1,2,2,"m.get_number_of_columns()",&local_720,"12"
             ,&local_760);
  boost::detail::shared_count::~shared_count(&sStack_5b8);
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2e0,0x19f);
  if (local_658._M_buckets[local_658._M_bucket_count != 1] != (__node_base_ptr)0x0) {
    p_Var34 = local_658._M_buckets[local_658._M_bucket_count != 1]->_M_nxt;
    uVar1 = *(uint *)&p_Var34[1]._M_nxt;
    while (uVar1 != 1) {
      p_Var34 = p_Var34->_M_nxt;
      if ((p_Var34 == (_Hash_node_base *)0x0) ||
         (uVar1 = *(uint *)&p_Var34[1]._M_nxt,
         (uint)((ulong)uVar1 % local_658._M_bucket_count) != (uint)(local_658._M_bucket_count != 1))
         ) goto LAB_0011bb95;
    }
    if (*(__node_base_ptr *)local_6d0._0_8_ != (__node_base_ptr)0x0) {
      p_Var3 = (*(__node_base_ptr *)local_6d0._0_8_)->_M_nxt;
      uVar1 = *(uint *)&p_Var3[1]._M_nxt;
      goto joined_r0x0011aa45;
    }
  }
  goto LAB_0011bb95;
  while( true ) {
    if (p_Var31 == (_Hash_node_base *)0x0) goto LAB_0011bb5e;
    if (*(int *)&p_Var31[2]._M_nxt == *(int *)((long)&p_Var3[1]._M_nxt + 4)) break;
LAB_0011aa7d:
    p_Var31 = p_Var31->_M_nxt;
    if (p_Var31 == p_Var34) break;
  }
  local_760 = (undefined **)CONCAT71(local_760._1_7_,p_Var31 == p_Var34);
  local_758 = 0;
  sStack_750.pi_ = (sp_counted_base *)0x0;
  local_740 = (undefined **)0x1897b9;
  local_738 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001b8350;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2f8 = "";
  local_708 = &local_740;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_750);
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_310,0x1a0);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_658._M_bucket_count;
  uVar32 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar13,0);
  if (local_658._M_buckets[uVar32 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var34 = local_658._M_buckets[uVar32 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var34[1]._M_nxt;
    while (uVar1 != 3) {
      p_Var34 = p_Var34->_M_nxt;
      if ((p_Var34 == (_Hash_node_base *)0x0) ||
         (uVar1 = *(uint *)&p_Var34[1]._M_nxt, (ulong)uVar1 % local_658._M_bucket_count != uVar32))
      goto LAB_0011bba1;
    }
    if (*(__node_base_ptr *)local_6d0._0_8_ != (__node_base_ptr)0x0) {
      p_Var3 = (*(__node_base_ptr *)local_6d0._0_8_)->_M_nxt;
      uVar1 = *(uint *)&p_Var3[1]._M_nxt;
      goto joined_r0x0011abab;
    }
  }
  goto LAB_0011bba1;
  while( true ) {
    if (p_Var31 == (_Hash_node_base *)0x0) goto LAB_0011bb5e;
    if (*(int *)&p_Var31[2]._M_nxt == *(int *)((long)&p_Var3[1]._M_nxt + 4)) break;
LAB_0011abe3:
    p_Var31 = p_Var31->_M_nxt;
    if (p_Var31 == p_Var34) break;
  }
  local_758 = 0;
  sStack_750.pi_ = (sp_counted_base *)0x0;
  local_740 = (undefined **)0x1897cf;
  local_738 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001b8350;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_328 = "";
  local_708 = &local_740;
  local_760._0_1_ = p_Var31 != p_Var34;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_750);
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_340,0x1a1);
  if (*local_658._M_buckets == (__node_base_ptr)0x0) {
LAB_0011bbc5:
    std::__throw_out_of_range("_Map_base::at");
  }
  p_Var34 = (*local_658._M_buckets)->_M_nxt;
  uVar1 = *(uint *)&p_Var34[1]._M_nxt;
  while (uVar1 != 0) {
    p_Var34 = p_Var34->_M_nxt;
    if ((p_Var34 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var34[1]._M_nxt, (ulong)uVar1 % local_658._M_bucket_count != 0))
    goto LAB_0011bbc5;
  }
  local_760._0_1_ = p_Var34[4]._M_nxt == p_Var34 + 4 || p_Var34[4]._M_nxt == (_Hash_node_base *)0x0;
  local_758 = 0;
  sStack_750.pi_ = (sp_counted_base *)0x0;
  local_740 = (undefined **)0x1897e6;
  local_738 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001b8350;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_358 = "";
  local_708 = &local_740;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_750);
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_368 = "";
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_370,0x1a2);
  if (local_658._M_buckets[local_658._M_bucket_count != 1] == (__node_base_ptr)0x0)
  goto LAB_0011bc3d;
  p_Var34 = local_658._M_buckets[local_658._M_bucket_count != 1]->_M_nxt;
  uVar1 = *(uint *)&p_Var34[1]._M_nxt;
  while (uVar1 != 1) {
    p_Var34 = p_Var34->_M_nxt;
    if ((p_Var34 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var34[1]._M_nxt,
       (uint)((ulong)uVar1 % local_658._M_bucket_count) != (uint)(local_658._M_bucket_count != 1)))
    {
LAB_0011bc3d:
      std::__throw_out_of_range("_Map_base::at");
    }
  }
  local_760._0_1_ = p_Var34[4]._M_nxt == p_Var34 + 4 || p_Var34[4]._M_nxt == (_Hash_node_base *)0x0;
  local_758 = 0;
  sStack_750.pi_ = (sp_counted_base *)0x0;
  local_740 = (undefined **)0x1897fa;
  local_738 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001b8350;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_388 = "";
  local_708 = &local_740;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_750);
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_398 = "";
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3a0,0x1a3);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_658._M_bucket_count;
  uVar32 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2)) % auVar14,0);
  if (local_658._M_buckets[uVar32 & 0xffffffff] == (__node_base_ptr)0x0) {
LAB_0011bc49:
    std::__throw_out_of_range("_Map_base::at");
  }
  p_Var34 = local_658._M_buckets[uVar32 & 0xffffffff]->_M_nxt;
  uVar1 = *(uint *)&p_Var34[1]._M_nxt;
  while (uVar1 != 2) {
    p_Var34 = p_Var34->_M_nxt;
    if ((p_Var34 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var34[1]._M_nxt, (ulong)uVar1 % local_658._M_bucket_count != uVar32))
    goto LAB_0011bc49;
  }
  local_760._0_1_ = p_Var34[4]._M_nxt == p_Var34 + 4 || p_Var34[4]._M_nxt == (_Hash_node_base *)0x0;
  local_758 = 0;
  sStack_750.pi_ = (sp_counted_base *)0x0;
  local_740 = (undefined **)0x18980e;
  local_738 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001b8350;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3b8 = "";
  local_708 = &local_740;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_750);
  local_3d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3c8 = "";
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3d0,0x1a4);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_658._M_bucket_count;
  uVar32 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar15,0);
  if (local_658._M_buckets[uVar32 & 0xffffffff] == (__node_base_ptr)0x0) goto LAB_0011bc55;
  p_Var34 = local_658._M_buckets[uVar32 & 0xffffffff]->_M_nxt;
  uVar1 = *(uint *)&p_Var34[1]._M_nxt;
  while (uVar1 != 3) {
    p_Var34 = p_Var34->_M_nxt;
    if ((p_Var34 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var34[1]._M_nxt, (ulong)uVar1 % local_658._M_bucket_count != uVar32)) {
LAB_0011bc55:
      std::__throw_out_of_range("_Map_base::at");
    }
  }
  local_760._0_1_ = p_Var34[4]._M_nxt != p_Var34 + 4 && p_Var34[4]._M_nxt != (_Hash_node_base *)0x0;
  local_758 = 0;
  sStack_750.pi_ = (sp_counted_base *)0x0;
  local_740 = (undefined **)0x189822;
  local_738 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001b8350;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_3f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3e8 = "";
  local_708 = &local_740;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_750);
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3f8 = "";
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_400,0x1a5);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_658._M_bucket_count;
  uVar32 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) % auVar16,0);
  if (local_658._M_buckets[uVar32 & 0xffffffff] == (__node_base_ptr)0x0) {
LAB_0011bc61:
    std::__throw_out_of_range("_Map_base::at");
  }
  p_Var34 = local_658._M_buckets[uVar32 & 0xffffffff]->_M_nxt;
  uVar1 = *(uint *)&p_Var34[1]._M_nxt;
  while (uVar1 != 4) {
    p_Var34 = p_Var34->_M_nxt;
    if ((p_Var34 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var34[1]._M_nxt, (ulong)uVar1 % local_658._M_bucket_count != uVar32))
    goto LAB_0011bc61;
  }
  local_760._0_1_ = p_Var34[4]._M_nxt == p_Var34 + 4 || p_Var34[4]._M_nxt == (_Hash_node_base *)0x0;
  local_758 = 0;
  sStack_750.pi_ = (sp_counted_base *)0x0;
  local_740 = (undefined **)0x189837;
  local_738 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001b8350;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_418 = "";
  local_708 = &local_740;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_750);
  local_430 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_428 = "";
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_430,0x1a6);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_658._M_bucket_count;
  uVar32 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(5)) % auVar17,0);
  if (local_658._M_buckets[uVar32 & 0xffffffff] == (__node_base_ptr)0x0) goto LAB_0011bc6d;
  p_Var34 = local_658._M_buckets[uVar32 & 0xffffffff]->_M_nxt;
  uVar1 = *(uint *)&p_Var34[1]._M_nxt;
  while (uVar1 != 5) {
    p_Var34 = p_Var34->_M_nxt;
    if ((p_Var34 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var34[1]._M_nxt, (ulong)uVar1 % local_658._M_bucket_count != uVar32)) {
LAB_0011bc6d:
      std::__throw_out_of_range("_Map_base::at");
    }
  }
  local_760._0_1_ = p_Var34[4]._M_nxt != p_Var34 + 4 && p_Var34[4]._M_nxt != (_Hash_node_base *)0x0;
  local_758 = 0;
  sStack_750.pi_ = (sp_counted_base *)0x0;
  local_740 = (undefined **)0x18984b;
  local_738 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001b8350;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_450 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_448 = "";
  local_708 = &local_740;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_750);
  local_460 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_458 = "";
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_460,0x1a7);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = local_658._M_bucket_count;
  uVar32 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(6)) % auVar18,0);
  if (local_658._M_buckets[uVar32 & 0xffffffff] == (__node_base_ptr)0x0) {
LAB_0011bc79:
    std::__throw_out_of_range("_Map_base::at");
  }
  p_Var34 = local_658._M_buckets[uVar32 & 0xffffffff]->_M_nxt;
  uVar1 = *(uint *)&p_Var34[1]._M_nxt;
  while (uVar1 != 6) {
    p_Var34 = p_Var34->_M_nxt;
    if ((p_Var34 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var34[1]._M_nxt, (ulong)uVar1 % local_658._M_bucket_count != uVar32))
    goto LAB_0011bc79;
  }
  local_760._0_1_ = p_Var34[4]._M_nxt != p_Var34 + 4 && p_Var34[4]._M_nxt != (_Hash_node_base *)0x0;
  local_758 = 0;
  sStack_750.pi_ = (sp_counted_base *)0x0;
  local_740 = (undefined **)0x189860;
  local_738 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001b8350;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_480 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_478 = "";
  local_708 = &local_740;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_750);
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_488 = "";
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_490,0x1a8);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_658._M_bucket_count;
  uVar32 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(7)) % auVar19,0);
  if (local_658._M_buckets[uVar32 & 0xffffffff] == (__node_base_ptr)0x0) goto LAB_0011bc85;
  p_Var34 = local_658._M_buckets[uVar32 & 0xffffffff]->_M_nxt;
  uVar1 = *(uint *)&p_Var34[1]._M_nxt;
  while (uVar1 != 7) {
    p_Var34 = p_Var34->_M_nxt;
    if ((p_Var34 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var34[1]._M_nxt, (ulong)uVar1 % local_658._M_bucket_count != uVar32)) {
LAB_0011bc85:
      std::__throw_out_of_range("_Map_base::at");
    }
  }
  local_760._0_1_ = p_Var34[4]._M_nxt != p_Var34 + 4 && p_Var34[4]._M_nxt != (_Hash_node_base *)0x0;
  local_758 = 0;
  sStack_750.pi_ = (sp_counted_base *)0x0;
  local_740 = (undefined **)0x189875;
  local_738 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001b8350;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_4b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4a8 = "";
  local_708 = &local_740;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_750);
  local_4c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4b8 = "";
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4c0,0x1a9);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_658._M_bucket_count;
  uVar32 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(8)) % auVar20,0);
  if (local_658._M_buckets[uVar32 & 0xffffffff] == (__node_base_ptr)0x0) {
LAB_0011bc91:
    std::__throw_out_of_range("_Map_base::at");
  }
  p_Var34 = local_658._M_buckets[uVar32 & 0xffffffff]->_M_nxt;
  uVar1 = *(uint *)&p_Var34[1]._M_nxt;
  while (uVar1 != 8) {
    p_Var34 = p_Var34->_M_nxt;
    if ((p_Var34 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var34[1]._M_nxt, (ulong)uVar1 % local_658._M_bucket_count != uVar32))
    goto LAB_0011bc91;
  }
  local_760._0_1_ = p_Var34[4]._M_nxt != p_Var34 + 4 && p_Var34[4]._M_nxt != (_Hash_node_base *)0x0;
  local_758 = 0;
  sStack_750.pi_ = (sp_counted_base *)0x0;
  local_740 = (undefined **)0x18988a;
  local_738 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001b8350;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_4e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4d8 = "";
  local_708 = &local_740;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_750);
  local_4f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4e8 = "";
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4f0,0x1aa);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_658._M_bucket_count;
  uVar32 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(9)) % auVar21,0);
  if (local_658._M_buckets[uVar32 & 0xffffffff] == (__node_base_ptr)0x0) goto LAB_0011bc9d;
  p_Var34 = local_658._M_buckets[uVar32 & 0xffffffff]->_M_nxt;
  uVar1 = *(uint *)&p_Var34[1]._M_nxt;
  while (uVar1 != 9) {
    p_Var34 = p_Var34->_M_nxt;
    if ((p_Var34 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var34[1]._M_nxt, (ulong)uVar1 % local_658._M_bucket_count != uVar32)) {
LAB_0011bc9d:
      std::__throw_out_of_range("_Map_base::at");
    }
  }
  local_760._0_1_ = p_Var34[4]._M_nxt != p_Var34 + 4 && p_Var34[4]._M_nxt != (_Hash_node_base *)0x0;
  local_758 = 0;
  sStack_750.pi_ = (sp_counted_base *)0x0;
  local_740 = (undefined **)0x18989f;
  local_738 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001b8350;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_510 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_508 = "";
  local_708 = &local_740;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_750);
  local_520 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_518 = "";
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_520,0x1ab);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_658._M_bucket_count;
  uVar32 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(10)) % auVar22,0);
  if (local_658._M_buckets[uVar32 & 0xffffffff] == (__node_base_ptr)0x0) {
LAB_0011bca9:
    std::__throw_out_of_range("_Map_base::at");
  }
  p_Var34 = local_658._M_buckets[uVar32 & 0xffffffff]->_M_nxt;
  uVar1 = *(uint *)&p_Var34[1]._M_nxt;
  while (uVar1 != 10) {
    p_Var34 = p_Var34->_M_nxt;
    if ((p_Var34 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var34[1]._M_nxt, (ulong)uVar1 % local_658._M_bucket_count != uVar32))
    goto LAB_0011bca9;
  }
  local_760._0_1_ = p_Var34[4]._M_nxt != p_Var34 + 4 && p_Var34[4]._M_nxt != (_Hash_node_base *)0x0;
  local_758 = 0;
  sStack_750.pi_ = (sp_counted_base *)0x0;
  local_740 = (undefined **)0x1898bd;
  local_738 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001b8350;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_540 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_538 = "";
  local_708 = &local_740;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_750);
  local_550 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_548 = "";
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_550,0x1ac);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = local_658._M_bucket_count;
  uVar32 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xb)) % auVar23,0);
  if (local_658._M_buckets[uVar32 & 0xffffffff] == (__node_base_ptr)0x0) goto LAB_0011bcb5;
  p_Var34 = local_658._M_buckets[uVar32 & 0xffffffff]->_M_nxt;
  uVar1 = *(uint *)&p_Var34[1]._M_nxt;
  while (uVar1 != 0xb) {
    p_Var34 = p_Var34->_M_nxt;
    if ((p_Var34 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var34[1]._M_nxt, (ulong)uVar1 % local_658._M_bucket_count != uVar32)) {
LAB_0011bcb5:
      std::__throw_out_of_range("_Map_base::at");
    }
  }
  local_760 = (undefined **)
              CONCAT71(local_760._1_7_,
                       p_Var34[4]._M_nxt != p_Var34 + 4 &&
                       p_Var34[4]._M_nxt != (_Hash_node_base *)0x0);
  local_758 = 0;
  sStack_750.pi_ = (sp_counted_base *)0x0;
  local_740 = (undefined **)0x1898d3;
  local_738 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001b8350;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_570 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_568 = "";
  local_708 = &local_740;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_750);
  local_580 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_578 = "";
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_580,0x1ad);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_658._M_bucket_count;
  uVar32 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar24,0);
  if (local_658._M_buckets[uVar32 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var34 = local_658._M_buckets[uVar32 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var34[1]._M_nxt;
    while (uVar1 != 3) {
      p_Var34 = p_Var34->_M_nxt;
      if ((p_Var34 == (_Hash_node_base *)0x0) ||
         (uVar1 = *(uint *)&p_Var34[1]._M_nxt, (ulong)uVar1 % local_658._M_bucket_count != uVar32))
      goto LAB_0011bbad;
    }
    if (*(__buckets_ptr)(local_6d0._0_8_ + (ulong)(local_6d0._8_8_ != 1) * 8) !=
        (__node_base_ptr)0x0) {
      p_Var3 = (*(__buckets_ptr)(local_6d0._0_8_ + (ulong)(local_6d0._8_8_ != 1) * 8))->_M_nxt;
      uVar1 = *(uint *)&p_Var3[1]._M_nxt;
      goto joined_r0x0011b9d9;
    }
  }
  goto LAB_0011bbad;
LAB_0011ba0c:
  do {
    p_Var31 = p_Var31->_M_nxt;
    if (p_Var31 == p_Var34) break;
    if (p_Var31 == (_Hash_node_base *)0x0) {
LAB_0011bb5e:
      __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                    "static pointer boost::intrusive::bhtraits_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true>>>, boost::intrusive::list_node<void *> *, Gudhi::persistence_matrix::Matrix<Base_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true>>::Matrix_column_tag, 1>::to_value_ptr(const node_ptr &) [T = Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true>>>, NodePtr = boost::intrusive::list_node<void *> *, Tag = Gudhi::persistence_matrix::Matrix<Base_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true>>::Matrix_column_tag, Type = 1]"
                   );
    }
  } while (*(int *)&p_Var31[2]._M_nxt != *(int *)((long)&p_Var3[1]._M_nxt + 4));
  local_760 = (undefined **)CONCAT71(local_760._1_7_,p_Var31 != p_Var34);
  local_758 = 0;
  sStack_750.pi_ = (sp_counted_base *)0x0;
  local_740 = (undefined **)0x1898e9;
  local_738 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001b8350;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_5a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_598 = "";
  local_708 = &local_740;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_750);
  ppVar25 = local_6d8;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&local_658);
  ppVar26 = local_6d8;
  local_620 = 0;
  local_618 = ppVar25;
  if (local_6d8 != (pool<boost::default_user_allocator_malloc_free> *)0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory(local_6d8);
  }
  operator_delete(ppVar26,0x38);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_658);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)(local_6d0 + 0x38));
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_6d0);
  if (local_610.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (mapped_type *)0x0) {
    operator_delete(local_610.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_610.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_610.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_5f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (mapped_type *)0x0) {
    operator_delete(local_5f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_5f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_5f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_5e0);
  return;
  while ((p_Var3 = p_Var3->_M_nxt, p_Var3 != (_Hash_node_base *)0x0 &&
         (uVar1 = *(uint *)&p_Var3[1]._M_nxt, (ulong)uVar1 % (ulong)local_6d0._8_8_ == 0))) {
joined_r0x0011aa45:
    if (uVar1 == 0) {
      p_Var34 = p_Var34 + 4;
      p_Var31 = p_Var34;
      goto LAB_0011aa7d;
    }
  }
LAB_0011bb95:
  std::__throw_out_of_range("_Map_base::at");
  while ((p_Var3 = p_Var3->_M_nxt, p_Var3 != (_Hash_node_base *)0x0 &&
         (uVar1 = *(uint *)&p_Var3[1]._M_nxt, (ulong)uVar1 % (ulong)local_6d0._8_8_ == 0))) {
joined_r0x0011abab:
    if (uVar1 == 0) {
      p_Var34 = p_Var34 + 4;
      p_Var31 = p_Var34;
      goto LAB_0011abe3;
    }
  }
LAB_0011bba1:
  std::__throw_out_of_range("_Map_base::at");
  while ((p_Var3 = p_Var3->_M_nxt, p_Var3 != (_Hash_node_base *)0x0 &&
         (uVar1 = *(uint *)&p_Var3[1]._M_nxt,
         (uint)((ulong)uVar1 % (ulong)local_6d0._8_8_) == (uint)(local_6d0._8_8_ != 1)))) {
joined_r0x0011b9d9:
    if (uVar1 == 1) {
      p_Var34 = p_Var34 + 4;
      p_Var31 = p_Var34;
      goto LAB_0011ba0c;
    }
  }
LAB_0011bbad:
  std::__throw_out_of_range("_Map_base::at");
  while ((p_Var3 = p_Var3->_M_nxt, p_Var3 != (_Hash_node_base *)0x0 &&
         (uVar1 = *(uint *)&p_Var3[1]._M_nxt, (ulong)uVar1 % (ulong)local_6d0._8_8_ == 0))) {
joined_r0x00119884:
    if (uVar1 == 0) {
      p_Var34 = p_Var34 + 4;
      p_Var31 = p_Var34;
      goto LAB_001198bc;
    }
  }
LAB_0011bb89:
  std::__throw_out_of_range("_Map_base::at");
  while ((p_Var3 = p_Var3->_M_nxt, p_Var3 != (_Hash_node_base *)0x0 &&
         (uVar1 = *(uint *)&p_Var3[1]._M_nxt, (ulong)uVar1 % (ulong)local_6d0._8_8_ == 0))) {
joined_r0x0011970e:
    if (uVar1 == 0) {
      p_Var34 = p_Var34 + 4;
      p_Var31 = p_Var34;
      goto LAB_00119746;
    }
  }
LAB_0011bb7d:
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

void test_general_insertion() {
  auto columns = build_general_matrix<typename Matrix::Column>();
  auto col2 = columns.back();
  columns.pop_back();
  auto col1 = columns.back();
  columns.pop_back();

  Matrix m(columns, 5);
  BOOST_CHECK(m.is_zero_entry(1, 0));
  BOOST_CHECK(!m.is_zero_entry(3, 0));
  BOOST_CHECK(m.is_zero_column(0));
  BOOST_CHECK(m.is_zero_column(1));
  BOOST_CHECK(m.is_zero_column(2));
  BOOST_CHECK(!m.is_zero_column(3));
  BOOST_CHECK(m.is_zero_column(4));
  BOOST_CHECK(!m.is_zero_column(5));
  BOOST_CHECK(!m.is_zero_column(6));
  BOOST_CHECK(!m.is_zero_column(7));
  BOOST_CHECK(!m.is_zero_column(8));
  BOOST_CHECK(!m.is_zero_column(9));
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 10);
  m.insert_column(col1);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 11);
  m.insert_column(col2);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 12);
  BOOST_CHECK(m.is_zero_entry(1, 0));
  BOOST_CHECK(!m.is_zero_entry(3, 0));
  BOOST_CHECK(m.is_zero_column(0));
  BOOST_CHECK(m.is_zero_column(1));
  BOOST_CHECK(m.is_zero_column(2));
  BOOST_CHECK(!m.is_zero_column(3));
  BOOST_CHECK(m.is_zero_column(4));
  BOOST_CHECK(!m.is_zero_column(5));
  BOOST_CHECK(!m.is_zero_column(6));
  BOOST_CHECK(!m.is_zero_column(7));
  BOOST_CHECK(!m.is_zero_column(8));
  BOOST_CHECK(!m.is_zero_column(9));
  BOOST_CHECK(!m.is_zero_column(10));
  BOOST_CHECK(!m.is_zero_column(11));
  BOOST_CHECK(!m.is_zero_entry(3, 1));
}